

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

PCMSegment *
Storage::Encodings::AppleGCR::Macintosh::data
          (PCMSegment *__return_storage_ptr__,uint8_t sector,uint8_t *source)

{
  value_type vVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  reference pvVar6;
  byte *pbVar7;
  byte local_61;
  ulong uStack_60;
  uint8_t values [3];
  size_t c;
  int checksum [3];
  allocator<unsigned_char> local_39;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  uint8_t *source_local;
  uint8_t sector_local;
  
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = source;
  std::allocator<unsigned_char>::allocator(&local_39);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0x2c6,&local_39);
  std::allocator<unsigned_char>::~allocator(&local_39);
  memset(&c,0,0xc);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
  *pvVar6 = 0xd5;
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,1);
  *pvVar6 = 0xaa;
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,2);
  *pvVar6 = 0xad;
  vVar1 = (anonymous_namespace)::six_and_two_mapping[(int)(sector & 0x3f)];
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,3);
  *pvVar6 = vVar1;
  for (uStack_60 = 0; uStack_60 < 0xaf; uStack_60 = uStack_60 + 1) {
    c._0_4_ = (uint)c << 1 | (int)(uint)c >> 7;
    bVar2 = *output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage ^ (byte)(uint)c;
    uVar4 = (uint)*output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + ((int)(uint)c >> 8) + checksum[0];
    bVar3 = output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage[1] ^ (byte)uVar4;
    uVar5 = (uint)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[1] + ((int)uVar4 >> 8) + c._4_4_;
    pbVar7 = output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 2;
    if (uStack_60 == 0xae) {
      local_61 = 0;
      output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pbVar7;
    }
    else {
      local_61 = *pbVar7 ^ (byte)uVar5;
      c._0_4_ = (uint)*pbVar7 + ((int)uVar5 >> 8) + (uint)c;
      output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 3;
    }
    c._0_4_ = (uint)c & 0xff;
    c._4_4_ = uVar5 & 0xff;
    checksum[0] = uVar4 & 0xff;
    vVar1 = (anonymous_namespace)::six_and_two_mapping[(int)(bVar2 & 0x3f)];
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                        uStack_60 * 4 + 5);
    *pvVar6 = vVar1;
    vVar1 = (anonymous_namespace)::six_and_two_mapping[(int)(bVar3 & 0x3f)];
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                        uStack_60 * 4 + 6);
    *pvVar6 = vVar1;
    vVar1 = (anonymous_namespace)::six_and_two_mapping[(int)(local_61 & 0x3f)];
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                        uStack_60 * 4 + 7);
    *pvVar6 = vVar1;
    vVar1 = (anonymous_namespace)::six_and_two_mapping
            [(int)((int)(uint)bVar2 >> 2 & 0x30U | (int)(uint)bVar3 >> 4 & 0xcU |
                  (int)(uint)local_61 >> 6)];
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                        uStack_60 * 4 + 4);
    *pvVar6 = vVar1;
  }
  vVar1 = (anonymous_namespace)::six_and_two_mapping[checksum[0] & 0x3f];
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0x2c0);
  *pvVar6 = vVar1;
  vVar1 = (anonymous_namespace)::six_and_two_mapping[c._4_4_ & 0x3f];
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0x2c1);
  *pvVar6 = vVar1;
  vVar1 = (anonymous_namespace)::six_and_two_mapping[(uint)c & 0x3f];
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0x2c2);
  *pvVar6 = vVar1;
  vVar1 = (anonymous_namespace)::six_and_two_mapping
          [(uint)checksum[0] >> 2 & 0x30 | c._4_4_ >> 4 & 0xc | (uint)c >> 6 & 3];
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0x2bf);
  *pvVar6 = vVar1;
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0x2c3);
  *pvVar6 = 0xde;
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0x2c4);
  *pvVar6 = 0xaa;
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0x2c5);
  *pvVar6 = 0xeb;
  Disk::PCMSegment::PCMSegment
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Storage::Disk::PCMSegment AppleGCR::Macintosh::data(uint8_t sector, const uint8_t *source) {
	std::vector<uint8_t> output(710);
	int checksum[3] = {0, 0, 0};

	// Write prologue.
	output[0] = data_prologue[0];
	output[1] = data_prologue[1];
	output[2] = data_prologue[2];

	// Add the sector number.
	output[3] = six_and_two_mapping[sector & 0x3f];

	// The Macintosh has a similar checksum-as-it-goes approach to encoding
	// to the Apple II, but works entirely differently. Each three bytes of
	// input are individually encoded to four GCR bytes, their output values
	// being a (mutating) function of the current checksum.
	//
	// Address references below, such as 'Cf. 18FA4' are to addresses in the
	// Macintosh Plus ROM.
	for(size_t c = 0; c < 175; ++c) {
		uint8_t values[3];

		// The low byte of the checksum is rotated left one position; Cf. 18FA4.
		checksum[0] = (checksum[0] << 1) | (checksum[0] >> 7);

		// See 18FBA and 18FBC: an ADDX (with the carry left over from the roll)
		// and an EOR act to update the checksum and generate the next output.
		values[0] = uint8_t(*source ^ checksum[0]);
		checksum[2] += *source + (checksum[0] >> 8);
		++source;

		// As above, but now 18FD0 and 18FD2.
		values[1] = uint8_t(*source ^ checksum[2]);
		checksum[1] += *source + (checksum[2] >> 8);
		++source;

		// Avoid a potential read overrun, but otherwise continue as before.
		if(c == 174) {
			values[2] = 0;
		} else {
			values[2] = uint8_t(*source ^ checksum[1]);
			checksum[0] += *source + (checksum[1] >> 8);
			++source;
		}

		// Throw away the top bits of checksum[1] and checksum[2]; the original
		// routine is byte centric, the longer ints here are just to retain the
		// carry after each add transientliy.
		checksum[0] &= 0xff;
		checksum[1] &= 0xff;
		checksum[2] &= 0xff;

		// Having mutated those three bytes according to the current checksum,
		// and the checksum according to those bytes, run them through the
		// GCR conversion table.
		output[4 + c*4 + 1] = six_and_two_mapping[values[0] & 0x3f];
		output[4 + c*4 + 2] = six_and_two_mapping[values[1] & 0x3f];
		output[4 + c*4 + 3] = six_and_two_mapping[values[2] & 0x3f];
		output[4 + c*4 + 0] = six_and_two_mapping[
			((values[0] >> 2) & 0x30) |
			((values[1] >> 4) & 0x0c) |
			((values[2] >> 6) & 0x03)
		];
	}

	// Also write the checksum.
	//
	// Caveat: the first byte written here will overwrite the final byte that
	// was deposited in the loop above. That's deliberate. The final byte from
	// the loop above doesn't contain any useful content, and isn't actually
	// included on disk.
	output[704] = six_and_two_mapping[checksum[2] & 0x3f];
	output[705] = six_and_two_mapping[checksum[1] & 0x3f];
	output[706] = six_and_two_mapping[checksum[0] & 0x3f];
	output[703] = six_and_two_mapping[
		((checksum[2] >> 2) & 0x30) |
		((checksum[1] >> 4) & 0x0c) |
		((checksum[0] >> 6) & 0x03)
	];

	// Write epilogue.
	output[707] = epilogue[0];
	output[708] = epilogue[1];
	output[709] = epilogue[2];

	return Storage::Disk::PCMSegment(output);
}